

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironmentAt
          (sysbvm_context_t *context,sysbvm_tuple_t astNode_,sysbvm_tuple_t expectedType_,
          sysbvm_tuple_t environment_,sysbvm_tuple_t sourcePosition_)

{
  sysbvm_tuple_t sourcePosition;
  undefined1 local_88 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_48_6_07223e53 gcFrame;
  sysbvm_tuple_t sourcePosition__local;
  sysbvm_tuple_t environment__local;
  sysbvm_tuple_t expectedType__local;
  sysbvm_tuple_t astNode__local;
  sysbvm_context_t *context_local;
  
  gcFrameRecord.roots = (sysbvm_tuple_t *)astNode_;
  if (astNode_ == 0) {
    memset(local_88,0,0x20);
    gcFrameRecord.previous._0_4_ = 0;
    gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
    gcFrameRecord._12_4_ = 0;
    gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_88);
    sourcePosition = sysbvm_type_getDefaultValue(context,expectedType_);
    context_local =
         (sysbvm_context_t *)sysbvm_astLiteralNode_create(context,sourcePosition,sourcePosition_);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_88);
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                   (context,astNode_,expectedType_,environment_);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironmentAt(sysbvm_context_t *context, sysbvm_tuple_t astNode_, sysbvm_tuple_t expectedType_, sysbvm_tuple_t environment_, sysbvm_tuple_t sourcePosition_)
{
    struct {
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t expectedType;
        sysbvm_tuple_t environment;
        sysbvm_tuple_t sourcePosition;

        sysbvm_tuple_t defaultValue;
        sysbvm_tuple_t result;
    } gcFrame = {
        .astNode = astNode_,
        .expectedType = expectedType_,
        .environment = environment_,
        .sourcePosition = sourcePosition_
    };

    if(!gcFrame.astNode)
    {
        SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
        gcFrame.defaultValue = sysbvm_type_getDefaultValue(context, gcFrame.expectedType);
        gcFrame.result = sysbvm_astLiteralNode_create(context, gcFrame.defaultValue, gcFrame.sourcePosition);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }
    else
    {
        return sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.astNode, gcFrame.expectedType, gcFrame.environment);
    }
}